

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall irr::video::CImage::copyTo(CImage *this,IImage *target,vector2d<int> *pos)

{
  dimension2d<unsigned_int> dVar1;
  bool bVar2;
  s32 sVar3;
  ECOLOR_FORMAT destFormat;
  ECOLOR_FORMAT EVar4;
  u32 uVar5;
  dimension2d<unsigned_int> *pdVar6;
  void *pvVar7;
  int *in_RDX;
  IImage *in_RSI;
  long *in_RDI;
  double __x;
  dimension2du dim;
  rect<int> *in_stack_00000058;
  IImage *in_stack_00000060;
  vector2d<int> *in_stack_00000068;
  rect<int> *in_stack_00000070;
  IImage *in_stack_00000078;
  eBlitter in_stack_00000080;
  u32 in_stack_00000090;
  uint uStack_1c;
  
  bVar2 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI + 1));
  if (bVar2) {
    os::Printer::log((Printer *)"IImage::copyTo method doesn\'t work with compressed images.",__x);
  }
  else {
    sVar3 = Blit(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                 in_stack_00000060,in_stack_00000058,in_stack_00000090);
    if ((((sVar3 == 0) && (in_RSI != (IImage *)0x0)) && (*in_RDX == 0)) && (in_RDX[1] == 0)) {
      EVar4 = *(ECOLOR_FORMAT *)(in_RDI + 1);
      destFormat = IImage::getColorFormat(in_RSI);
      bVar2 = CColorConverter::canConvertFormat(EVar4,destFormat);
      if (bVar2) {
        pdVar6 = IImage::getDimension(in_RSI);
        dVar1 = *pdVar6;
        pvVar7 = IImage::getData(in_RSI);
        uStack_1c = dVar1.Height;
        EVar4 = IImage::getColorFormat(in_RSI);
        uVar5 = IImage::getPitch(in_RSI);
        (**(code **)(*in_RDI + 0x28))(in_RDI,pvVar7,(ulong)dVar1 & 0xffffffff,uStack_1c,EVar4,uVar5)
        ;
      }
    }
  }
  return;
}

Assistant:

void CImage::copyTo(IImage *target, const core::position2d<s32> &pos)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyTo method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	if (!Blit(BLITTER_TEXTURE, target, 0, &pos, this, 0, 0) && target && pos.X == 0 && pos.Y == 0 &&
			CColorConverter::canConvertFormat(Format, target->getColorFormat())) {
		// No fast blitting, but copyToScaling uses other color conversions and might work
		irr::core::dimension2du dim(target->getDimension());
		copyToScaling(target->getData(), dim.Width, dim.Height, target->getColorFormat(), target->getPitch());
	}
}